

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void duckdb::AggregateExecutor::
     Finalize<duckdb::ArgMinMaxState<short,duckdb::string_t>,short,duckdb::ArgMinMaxBase<duckdb::LessThan,false>>
               (Vector *states,AggregateInputData *aggr_input_data,Vector *result,idx_t count,
               idx_t offset)

{
  data_ptr_t pdVar1;
  idx_t iVar2;
  short *target;
  AggregateFinalizeData finalize_data;
  
  finalize_data.result = result;
  finalize_data.input = aggr_input_data;
  if (states->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    finalize_data.result_idx = 0;
    ArgMinMaxBase<duckdb::LessThan,false>::
    Finalize<short,duckdb::ArgMinMaxState<short,duckdb::string_t>>
              (*(ArgMinMaxState<short,_duckdb::string_t> **)states->data,(short *)result->data,
               &finalize_data);
  }
  else {
    Vector::SetVectorType(result,FLAT_VECTOR);
    target = (short *)(result->data + offset * 2);
    pdVar1 = states->data;
    for (iVar2 = 0; count != iVar2; iVar2 = iVar2 + 1) {
      finalize_data.result_idx = offset + iVar2;
      ArgMinMaxBase<duckdb::LessThan,false>::
      Finalize<short,duckdb::ArgMinMaxState<short,duckdb::string_t>>
                (*(ArgMinMaxState<short,_duckdb::string_t> **)(pdVar1 + iVar2 * 8),target,
                 &finalize_data);
      target = target + 1;
    }
  }
  return;
}

Assistant:

static void Finalize(Vector &states, AggregateInputData &aggr_input_data, Vector &result, idx_t count,
	                     idx_t offset) {
		if (states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);

			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			auto rdata = ConstantVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			OP::template Finalize<RESULT_TYPE, STATE_TYPE>(**sdata, *rdata, finalize_data);
		} else {
			D_ASSERT(states.GetVectorType() == VectorType::FLAT_VECTOR);
			result.SetVectorType(VectorType::FLAT_VECTOR);

			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			auto rdata = FlatVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			for (idx_t i = 0; i < count; i++) {
				finalize_data.result_idx = i + offset;
				OP::template Finalize<RESULT_TYPE, STATE_TYPE>(*sdata[i], rdata[finalize_data.result_idx],
				                                               finalize_data);
			}
		}
	}